

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint recovery_count;
  uint input_count;
  uint seed;
  uint in_stack_0004fffc;
  uint in_stack_00050000;
  uint in_stack_00050004;
  
  InitField();
  InitFieldOperations();
  time((time_t *)0x0);
  do {
    test(in_stack_00050004,in_stack_00050000,in_stack_0004fffc);
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
    // Fill GFLog table and GFExp table
    InitField();

    // Compute factors used in erasure decoder
    InitFieldOperations();

    unsigned seed = (unsigned)time(NULL);
    for (;;)
    {
#ifdef LEO_SHORT_FIELD
        const unsigned input_count = 32;
        const unsigned recovery_count = 16;
#else // LEO_SHORT_FIELD
        const unsigned input_count = 32768;
        const unsigned recovery_count = 32768;
#endif // LEO_SHORT_FIELD

        test(input_count, recovery_count, seed);

        ++seed;
    }

    return 0;
}